

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_long_long,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,unsigned_long_long value,
               bool negative)

{
  bool bVar1;
  char_t *source;
  char_t *begin;
  char_t *end;
  char_t buf [64];
  bool negative_local;
  unsigned_long_long value_local;
  uintptr_t header_mask_local;
  unsigned_long *header_local;
  char **dest_local;
  
  source = anon_unknown_0::integer_to_string<unsigned_long_long>
                     ((char_t *)&end,buf + 0x38,value,negative);
  bVar1 = strcpy_insitu<char*,unsigned_long>
                    (dest,header,header_mask,source,(long)(buf + 0x38) - (long)source);
  return bVar1;
}

Assistant:

PUGI__FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}